

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

bool __thiscall FSerializer::BeginArray(FSerializer *this,char *name)

{
  FWriter *pFVar1;
  FReader *this_00;
  FJSONObject *pFVar2;
  TArray<FJSONObject,_FJSONObject> *pTVar3;
  uint uVar4;
  Value *pVVar5;
  
  if (this->w == (FWriter *)0x0) {
    pVVar5 = FReader::FindKey(this->r,name);
    if (pVVar5 == (Value *)0x0) {
      return false;
    }
    if ((pVVar5->data_).f.flags != 4) {
      __assert_fail("val->IsArray()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x28b,"bool FSerializer::BeginArray(const char *)");
    }
    this_00 = this->r;
    TArray<FJSONObject,_FJSONObject>::Grow(&this_00->mObjects,1);
    pFVar2 = (this_00->mObjects).Array;
    uVar4 = (this_00->mObjects).Count;
    pTVar3 = &this_00->mObjects;
    pFVar2[uVar4].mObject = pVVar5;
    pFVar2[uVar4].mIterator.ptr_ = (Pointer)0x0;
    pFVar2[uVar4].mIndex = 0;
  }
  else {
    WriteKey(this,name);
    FWriter::StartArray(this->w);
    pFVar1 = this->w;
    TArray<bool,_bool>::Grow(&pFVar1->mInObject,1);
    uVar4 = (pFVar1->mInObject).Count;
    pTVar3 = (TArray<FJSONObject,_FJSONObject> *)&pFVar1->mInObject;
    (pFVar1->mInObject).Array[uVar4] = false;
  }
  pTVar3->Count = uVar4 + 1;
  return true;
}

Assistant:

bool FSerializer::BeginArray(const char *name)
{
	if (isWriting())
	{
		WriteKey(name);
		w->StartArray();
		w->mInObject.Push(false);
	}
	else
	{
		auto val = r->FindKey(name);
		if (val != nullptr)
		{
			assert(val->IsArray());
			if (val->IsArray())
			{
				r->mObjects.Push(FJSONObject(val));
			}
			else
			{
				Printf(TEXTCOLOR_RED "Array expected for '%s'", name);
				mErrors++;
				return false;
			}
		}
		else
		{
			return false;
		}
	}
	return true;
}